

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Parser::_start_map_unk(Parser *this,bool as_child)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long in_RDI;
  bool bVar3;
  csubstr ka;
  bool in_stack_00000317;
  Parser *in_stack_00000318;
  
  if ((*(byte *)(in_RDI + 0xa40) & 1) == 0) {
    uVar1 = *(undefined8 *)(in_RDI + 0xa50);
    uVar2 = *(undefined8 *)(in_RDI + 0xa58);
    basic_substring<const_char>::operator=
              ((basic_substring<const_char> *)(in_RDI + 0xa50),(nullptr_t)0x0);
    _start_map(in_stack_00000318,in_stack_00000317);
    *(undefined8 *)(in_RDI + 0xa50) = uVar1;
    *(undefined8 *)(in_RDI + 0xa58) = uVar2;
  }
  else {
    _start_map(in_stack_00000318,in_stack_00000317);
    *(undefined1 *)(in_RDI + 0xa40) = 0;
  }
  bVar3 = false;
  if (*(long *)(in_RDI + 0xa20) != 0) {
    bVar3 = *(long *)(in_RDI + 0xa18) != 0;
  }
  if (bVar3) {
    *(undefined8 *)(in_RDI + 0xa08) = *(undefined8 *)(in_RDI + 0xa18);
    *(undefined8 *)(in_RDI + 0xa10) = *(undefined8 *)(in_RDI + 0xa20);
    *(undefined8 *)(in_RDI + 0x9f8) = *(undefined8 *)(in_RDI + 0xa00);
    basic_substring<const_char>::clear((basic_substring<const_char> *)(in_RDI + 0xa18));
    *(undefined8 *)(in_RDI + 0xa00) = 0;
  }
  return;
}

Assistant:

void Parser::_start_map_unk(bool as_child)
{
    if(!m_key_anchor_was_before)
    {
        _c4dbgpf("stash key anchor before starting map... '{}'", m_key_anchor);
        csubstr ka = m_key_anchor;
        m_key_anchor = {};
        _start_map(as_child);
        m_key_anchor = ka;
    }
    else
    {
        _start_map(as_child);
        m_key_anchor_was_before = false;
    }
    if(m_key_tag2.not_empty())
    {
        m_key_tag = m_key_tag2;
        m_key_tag_indentation = m_key_tag2_indentation;
        m_key_tag2.clear();
        m_key_tag2_indentation = 0;
    }
}